

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

bool __thiscall cmComputeLinkDepends::CheckCircularDependencies(cmComputeLinkDepends *this)

{
  cmComputeComponentGraph *pcVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  pointer pLVar5;
  pointer pcVar6;
  pointer pcVar7;
  size_t sVar8;
  cmake *this_00;
  ulong uVar9;
  ostream *poVar10;
  string *psVar11;
  long *plVar12;
  LinkEntry *entry;
  LinkEntry *entry_00;
  long lVar13;
  const_iterator __begin2;
  ulong uVar14;
  cmGraphEdge *ni;
  pointer pcVar15;
  string local_1d8;
  undefined1 local_1b8 [16];
  ostringstream e;
  
  pcVar1 = (this->CCG)._M_t.
           super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
           .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl;
  uVar9 = ((long)*(pointer *)
                  ((long)&(pcVar1->Components).
                          super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> + 8)
          - *(long *)&(pcVar1->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl)
          / 0x18;
  uVar14 = 0;
  do {
    if (uVar14 == uVar9) {
LAB_0047e9a4:
      return uVar9 <= uVar14;
    }
    lVar2 = *(long *)&(pcVar1->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl;
    lVar13 = uVar14 * 0x18;
    plVar12 = *(long **)(lVar2 + lVar13);
    plVar3 = *(long **)(lVar2 + 8 + lVar13);
    if (8 < (ulong)((long)plVar3 - (long)plVar12)) {
      while (plVar12 != plVar3) {
        lVar4 = *plVar12;
        plVar12 = plVar12 + 1;
        if ((this->EntryList).
            super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar4].Kind == Group) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar10 = std::operator<<((ostream *)&e,
                                    "The inter-target dependency graph, for the target \"");
          psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          poVar10 = std::operator<<(poVar10,(string *)psVar11);
          std::operator<<(poVar10,
                          "\", contains the following strongly connected component (cycle):\n");
          pcVar1 = (this->CCG)._M_t.
                   super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
                   .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl;
          plVar3 = (long *)((undefined8 *)(lVar2 + lVar13))[1];
          for (plVar12 = *(long **)(lVar2 + lVar13); plVar12 != plVar3; plVar12 = plVar12 + 1) {
            lVar2 = *plVar12;
            pLVar5 = (this->EntryList).
                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar10 = std::operator<<((ostream *)&e,"  ");
            const::$_0::operator()::LinkEntry_const___const(&local_1d8,pLVar5 + lVar2,entry);
            poVar10 = std::operator<<(poVar10,(string *)&local_1d8);
            std::operator<<(poVar10,"\n");
            std::__cxx11::string::~string((string *)&local_1d8);
            pcVar6 = (this->EntryConstraintGraph).
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                     super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar7 = *(pointer *)
                      ((long)&pcVar6[lVar2].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                              super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
            for (pcVar15 = *(pointer *)
                            &pcVar6[lVar2].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
                pcVar15 != pcVar7; pcVar15 = pcVar15 + 1) {
              sVar8 = pcVar15->Dest;
              if (*(ulong *)(*(long *)&(pcVar1->TarjanComponents).
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl + sVar8 * 8) == uVar14) {
                pLVar5 = (this->EntryList).
                         super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                poVar10 = std::operator<<((ostream *)&e,"    depends on ");
                const::$_0::operator()::LinkEntry_const___const(&local_1d8,pLVar5 + sVar8,entry_00);
                poVar10 = std::operator<<(poVar10,(string *)&local_1d8);
                std::operator<<(poVar10,"\n");
                std::__cxx11::string::~string((string *)&local_1d8);
              }
            }
          }
          this_00 = this->CMakeInstance;
          std::__cxx11::stringbuf::str();
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1b8);
          cmake::IssueMessage(this_00,FATAL_ERROR,&local_1d8,(cmListFileBacktrace *)local_1b8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          goto LAB_0047e9a4;
        }
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

bool cmComputeLinkDepends::CheckCircularDependencies() const
{
  std::vector<NodeList> const& components = this->CCG->GetComponents();
  size_t nc = components.size();
  for (size_t c = 0; c < nc; ++c) {
    // Get the current component.
    NodeList const& nl = components[c];

    // Skip trivial components.
    if (nl.size() < 2) {
      continue;
    }

    // no group must be evolved
    bool cycleDetected = false;
    for (size_t ni : nl) {
      if (this->EntryList[ni].Kind == LinkEntry::Group) {
        cycleDetected = true;
        break;
      }
    }
    if (!cycleDetected) {
      continue;
    }

    // Construct the error message.
    auto formatItem = [](LinkEntry const& entry) -> std::string {
      if (entry.Kind == LinkEntry::Group) {
        auto items =
          entry.Item.Value.substr(entry.Item.Value.find(':', 12) + 1);
        items.pop_back();
        std::replace(items.begin(), items.end(), '|', ',');
        return cmStrCat("group \"", ExtractGroupFeature(entry.Item.Value),
                        ":{", items, "}\"");
      }
      return cmStrCat('"', entry.Item.Value, '"');
    };

    std::ostringstream e;
    e << "The inter-target dependency graph, for the target \""
      << this->Target->GetName()
      << "\", contains the following strongly connected component "
         "(cycle):\n";
    std::vector<size_t> const& cmap = this->CCG->GetComponentMap();
    for (size_t i : nl) {
      // Get the depender.
      LinkEntry const& depender = this->EntryList[i];

      // Describe the depender.
      e << "  " << formatItem(depender) << "\n";

      // List its dependencies that are inside the component.
      EdgeList const& el = this->EntryConstraintGraph[i];
      for (cmGraphEdge const& ni : el) {
        size_t j = ni;
        if (cmap[j] == c) {
          LinkEntry const& dependee = this->EntryList[j];
          e << "    depends on " << formatItem(dependee) << "\n";
        }
      }
    }
    this->CMakeInstance->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                      this->Target->GetBacktrace());

    return false;
  }

  return true;
}